

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::notify_delete(CVmObjTads *this,int in_root_set)

{
  vm_tadsobj_hdr *this_00;
  
  this_00 = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  if (this_00 != (vm_tadsobj_hdr *)0x0) {
    vm_tadsobj_hdr::free_mem(this_00);
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
    return;
  }
  return;
}

Assistant:

void CVmObjTads::notify_delete(VMG_ int in_root_set)
{
    /* free our extension */
    if (ext_ != 0)
    {
        /* tell the header to delete its memory */
        get_hdr()->free_mem();

        /* delete the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}